

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

PropertyBase *
Protocol::MQTT::V5::
TypedProperty<(Protocol::MQTT::V5::PropertyType)38,_Protocol::MQTT::Common::DynamicStringPair>::
allocateProp(void)

{
  PropertyBase *this;
  DynamicString local_66;
  DynamicString local_46;
  DynamicStringPair local_34;
  
  this = (PropertyBase *)operator_new(0x48);
  Common::DynamicString::DynamicString(&local_46,"");
  Common::DynamicString::DynamicString(&local_66,"");
  Common::DynamicStringPair::DynamicStringPair(&local_34,&local_46,&local_66);
  Property<Protocol::MQTT::Common::DynamicStringPair>::Property
            ((Property<Protocol::MQTT::Common::DynamicStringPair> *)this,UserProperty,&local_34,true
            );
  Common::DynamicStringPair::~DynamicStringPair(&local_34);
  Common::DynamicString::~DynamicString(&local_66);
  Common::DynamicString::~DynamicString(&local_46);
  return this;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }